

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.c
# Opt level: O0

size_t ZSTD_estimateSubBlockSize
                 (BYTE *literals,size_t litSize,BYTE *ofCodeTable,BYTE *llCodeTable,
                 BYTE *mlCodeTable,size_t nbSeq,ZSTD_entropyCTables_t *entropy,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize,
                 int writeLitEntropy,int writeSeqEntropy)

{
  size_t sVar1;
  size_t sVar2;
  size_t cSizeEstimate;
  size_t nbSeq_local;
  BYTE *mlCodeTable_local;
  BYTE *llCodeTable_local;
  BYTE *ofCodeTable_local;
  size_t litSize_local;
  BYTE *literals_local;
  
  sVar1 = ZSTD_estimateSubBlockSize_literal
                    (literals,litSize,&entropy->huf,&entropyMetadata->hufMetadata,workspace,wkspSize
                     ,writeLitEntropy);
  sVar2 = ZSTD_estimateSubBlockSize_sequences
                    (ofCodeTable,llCodeTable,mlCodeTable,nbSeq,&entropy->fse,
                     &entropyMetadata->fseMetadata,workspace,wkspSize,writeSeqEntropy);
  return sVar2 + sVar1 + 3;
}

Assistant:

static size_t ZSTD_estimateSubBlockSize(const BYTE* literals, size_t litSize,
                                        const BYTE* ofCodeTable,
                                        const BYTE* llCodeTable,
                                        const BYTE* mlCodeTable,
                                        size_t nbSeq,
                                        const ZSTD_entropyCTables_t* entropy,
                                        const ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                                        void* workspace, size_t wkspSize,
                                        int writeLitEntropy, int writeSeqEntropy) {
    size_t cSizeEstimate = 0;
    cSizeEstimate += ZSTD_estimateSubBlockSize_literal(literals, litSize,
                                                         &entropy->huf, &entropyMetadata->hufMetadata,
                                                         workspace, wkspSize, writeLitEntropy);
    cSizeEstimate += ZSTD_estimateSubBlockSize_sequences(ofCodeTable, llCodeTable, mlCodeTable,
                                                         nbSeq, &entropy->fse, &entropyMetadata->fseMetadata,
                                                         workspace, wkspSize, writeSeqEntropy);
    return cSizeEstimate + ZSTD_blockHeaderSize;
}